

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  uint uVar7;
  uint uVar8;
  BYTE *oend_3;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  ulong *puVar18;
  BYTE *ip;
  long *plVar19;
  seqDef *psVar20;
  BYTE *pStart_7;
  int *piVar21;
  long *plVar22;
  uint uVar23;
  BYTE *pInLoopLimit_4;
  ulong *puVar24;
  long lVar25;
  BYTE *pStart_4;
  int iVar26;
  BYTE *pStart;
  ulong *puVar27;
  uint uVar28;
  BYTE *op;
  long *plVar29;
  ulong uVar30;
  int *piVar31;
  long lVar32;
  ulong uVar33;
  U32 UVar34;
  ulong uVar35;
  uint local_a4;
  ulong local_88;
  BYTE *base;
  BYTE *iend;
  BYTE *ilimit;
  U32 *hashTable;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  size_t stepSize;
  
  uVar8 = (ms->cParams).targetLength;
  uVar9 = (ulong)(uVar8 + 1 + (uint)(uVar8 == 0));
  pBVar5 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  piVar21 = (int *)(pBVar5 + uVar8);
  puVar2 = (ulong *)((long)src + srcSize);
  plVar29 = (long *)((long)src + (srcSize - 8));
  uVar17 = rep[1];
  plVar19 = (long *)((long)src + (ulong)(piVar21 == (int *)src));
  uVar23 = (int)plVar19 - (int)piVar21;
  local_a4 = uVar17;
  if (uVar23 < uVar17) {
    local_a4 = 0;
  }
  uVar3 = *rep;
  local_88 = 0;
  if (uVar3 <= uVar23) {
    local_88 = (ulong)uVar3;
  }
  plVar22 = (long *)((long)src + (ulong)(piVar21 == (int *)src) + 1);
  uVar7 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  iVar26 = (int)pBVar5;
  if (uVar7 == 5) {
    if (plVar22 < plVar29) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        lVar32 = *plVar19;
        uVar30 = (ulong)(lVar32 * -0x30e4432345000000) >> (bVar11 & 0x3f);
        lVar25 = *plVar22;
        uVar15 = (ulong)(lVar25 * -0x30e4432345000000) >> (bVar11 & 0x3f);
        uVar35 = (long)plVar19 - (long)pBVar5;
        uVar7 = pUVar6[uVar30];
        uVar4 = pUVar6[uVar15];
        UVar34 = (U32)uVar35;
        pUVar6[uVar30] = UVar34;
        pUVar6[uVar15] = (int)plVar22 - iVar26;
        uVar13 = (uint)local_88;
        if (uVar13 == 0) {
LAB_00110af6:
          if (((uVar8 < uVar7) &&
              (piVar16 = (int *)(pBVar5 + uVar7), plVar14 = plVar19, *piVar16 == (int)lVar32)) ||
             ((uVar8 < uVar4 &&
              (piVar16 = (int *)(pBVar5 + uVar4), plVar14 = plVar22, *piVar16 == (int)lVar25)))) {
            uVar7 = (int)plVar14 - (int)piVar16;
            local_88 = (ulong)uVar7;
            iVar12 = uVar7 + 2;
            local_a4 = uVar13;
            if ((piVar21 < piVar16) && (src < plVar14)) {
              uVar15 = 0;
              do {
                piVar31 = (int *)((long)piVar16 + -1);
                plVar19 = (long *)((long)plVar14 + -1);
                if ((*(char *)plVar19 != *(char *)piVar31) ||
                   (uVar15 = uVar15 + 1, piVar16 = piVar31, plVar14 = plVar19, piVar31 <= piVar21))
                break;
              } while (src < plVar19);
            }
            else {
              uVar15 = 0;
            }
            goto LAB_00110bbb;
          }
          lVar32 = ((long)plVar19 - (long)src >> 7) + uVar9;
          plVar19 = (long *)((long)plVar19 + lVar32);
          plVar22 = (long *)((long)plVar22 + lVar32);
        }
        else {
          piVar16 = (int *)((long)plVar19 + (2 - local_88));
          if (*piVar16 != *(int *)((long)plVar19 + 2)) goto LAB_00110af6;
          uVar15 = (ulong)(*(char *)((long)plVar19 + 1) == *(char *)((long)piVar16 + -1));
          iVar12 = 0;
          piVar16 = (int *)((long)piVar16 - uVar15);
          plVar14 = (long *)((long)plVar19 + (2 - uVar15));
LAB_00110bbb:
          puVar24 = (ulong *)((long)plVar14 + uVar15 + 4);
          puVar27 = (ulong *)((long)piVar16 + uVar15 + 4);
          puVar18 = puVar24;
          if (puVar24 < puVar1) {
            if (*puVar27 == *puVar24) {
              lVar32 = 0;
              do {
                puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                if (puVar1 <= puVar18) {
                  puVar27 = (ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                  puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                  goto LAB_00110c51;
                }
                uVar30 = *(ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                uVar10 = *puVar18;
                lVar32 = lVar32 + 8;
              } while (uVar30 == uVar10);
              uVar10 = uVar10 ^ uVar30;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar10 = *puVar24 ^ *puVar27;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = uVar30 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00110c51:
            if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar18 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar18 < puVar2) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar27 == (char)*puVar18));
            }
            uVar30 = (long)puVar18 - (long)puVar24;
          }
          uVar10 = (long)plVar14 - (long)src;
          plVar22 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar22 + uVar10);
          do {
            *plVar22 = *src;
            plVar22 = plVar22 + 1;
            src = (void *)((long)src + 8);
          } while (plVar22 < plVar19);
          seqStore->lit = seqStore->lit + uVar10;
          if (uVar10 < 0x10000) {
            psVar20 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar20 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = (uVar15 + 4 + uVar30) - 3;
          psVar20->litLength = (U16)uVar10;
          psVar20->offset = iVar12 + 1;
          if (0xffff < uVar33) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar32 = uVar15 + 4 + uVar30;
          psVar20->matchLength = (U16)uVar33;
          seqStore->sequences = psVar20 + 1;
          plVar19 = (long *)((long)plVar14 + lVar32);
          plVar22 = (long *)((long)plVar14 + lVar32 + 1);
          src = plVar19;
          if (plVar19 <= plVar29) {
            pUVar6[(ulong)(*(long *)(pBVar5 + (uVar35 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar11 & 0x3f)] = UVar34 + 2;
            pUVar6[(ulong)(*(long *)((long)plVar19 - 2) * -0x30e4432345000000) >> (bVar11 & 0x3f)] =
                 ((int)plVar19 + -2) - iVar26;
            if ((local_a4 != 0) &&
               (uVar15 = (ulong)local_a4, (int)*plVar19 == *(int *)((long)plVar19 - uVar15))) {
              do {
                plVar22 = plVar19;
                uVar30 = local_88;
                lVar32 = -uVar15;
                local_88 = (ulong)local_a4;
                puVar18 = (ulong *)((long)plVar22 + 4);
                puVar27 = (ulong *)((long)plVar22 + lVar32 + 4);
                puVar24 = puVar18;
                if (puVar18 < puVar1) {
                  if (*puVar27 == *puVar18) {
                    lVar25 = 0;
                    do {
                      puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                      if (puVar1 <= puVar24) {
                        puVar27 = (ulong *)((long)plVar22 + lVar32 + lVar25 + 0xc);
                        puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                        goto LAB_00110e4b;
                      }
                      uVar15 = *(ulong *)((long)plVar22 + lVar25 + lVar32 + 0xc);
                      uVar35 = *puVar24;
                      lVar25 = lVar25 + 8;
                    } while (uVar15 == uVar35);
                    uVar35 = uVar35 ^ uVar15;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = (uVar15 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar35 = *puVar18 ^ *puVar27;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = uVar15 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00110e4b:
                  if ((puVar24 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar24))
                  {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar24 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar24 < puVar2) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar27 == (char)*puVar24));
                  }
                  uVar35 = (long)puVar24 - (long)puVar18;
                }
                pUVar6[(ulong)(*plVar22 * -0x30e4432345000000) >> (bVar11 & 0x3f)] =
                     (int)plVar22 - iVar26;
                *(long *)seqStore->lit = *plVar22;
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offset = 1;
                if (0xffff < uVar35 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar19 = (long *)((long)plVar22 + uVar35 + 4);
                psVar20->matchLength = (U16)(uVar35 + 1);
                seqStore->sequences = psVar20 + 1;
                local_a4 = (uint)uVar30;
              } while (((plVar19 <= plVar29) && (local_a4 != 0)) &&
                      (uVar15 = uVar30, (int)*plVar19 == *(int *)((long)plVar19 - uVar30)));
              plVar22 = (long *)((long)plVar22 + uVar35 + 5);
              src = plVar19;
            }
          }
        }
      } while (plVar22 < plVar29);
    }
  }
  else if (uVar7 == 6) {
    if (plVar22 < plVar29) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        lVar32 = *plVar19;
        uVar30 = (ulong)(lVar32 * -0x30e4432340650000) >> (bVar11 & 0x3f);
        lVar25 = *plVar22;
        uVar15 = (ulong)(lVar25 * -0x30e4432340650000) >> (bVar11 & 0x3f);
        uVar35 = (long)plVar19 - (long)pBVar5;
        uVar7 = pUVar6[uVar30];
        uVar4 = pUVar6[uVar15];
        UVar34 = (U32)uVar35;
        pUVar6[uVar30] = UVar34;
        pUVar6[uVar15] = (int)plVar22 - iVar26;
        uVar13 = (uint)local_88;
        if (uVar13 == 0) {
LAB_001105f7:
          if (((uVar8 < uVar7) &&
              (piVar16 = (int *)(pBVar5 + uVar7), plVar14 = plVar19, *piVar16 == (int)lVar32)) ||
             ((uVar8 < uVar4 &&
              (piVar16 = (int *)(pBVar5 + uVar4), plVar14 = plVar22, *piVar16 == (int)lVar25)))) {
            uVar7 = (int)plVar14 - (int)piVar16;
            local_88 = (ulong)uVar7;
            iVar12 = uVar7 + 2;
            local_a4 = uVar13;
            if ((piVar21 < piVar16) && (src < plVar14)) {
              uVar15 = 0;
              do {
                piVar31 = (int *)((long)piVar16 + -1);
                plVar19 = (long *)((long)plVar14 + -1);
                if ((*(char *)plVar19 != *(char *)piVar31) ||
                   (uVar15 = uVar15 + 1, plVar14 = plVar19, piVar16 = piVar31, piVar31 <= piVar21))
                break;
              } while (src < plVar19);
            }
            else {
              uVar15 = 0;
            }
            goto LAB_001106c3;
          }
          lVar32 = ((long)plVar19 - (long)src >> 7) + uVar9;
          plVar19 = (long *)((long)plVar19 + lVar32);
          plVar22 = (long *)((long)plVar22 + lVar32);
        }
        else {
          piVar16 = (int *)((long)plVar19 + (2 - local_88));
          if (*piVar16 != *(int *)((long)plVar19 + 2)) goto LAB_001105f7;
          uVar15 = (ulong)(*(char *)((long)plVar19 + 1) == *(char *)((long)piVar16 + -1));
          iVar12 = 0;
          plVar14 = (long *)((long)plVar19 + (2 - uVar15));
          piVar16 = (int *)((long)piVar16 - uVar15);
LAB_001106c3:
          puVar27 = (ulong *)((long)plVar14 + uVar15 + 4);
          puVar24 = (ulong *)((long)piVar16 + uVar15 + 4);
          puVar18 = puVar27;
          if (puVar27 < puVar1) {
            if (*puVar24 == *puVar27) {
              lVar32 = 0;
              do {
                puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                if (puVar1 <= puVar18) {
                  puVar24 = (ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                  puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                  goto LAB_00110753;
                }
                uVar30 = *(ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                uVar10 = *puVar18;
                lVar32 = lVar32 + 8;
              } while (uVar30 == uVar10);
              uVar10 = uVar10 ^ uVar30;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar10 = *puVar27 ^ *puVar24;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = uVar30 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00110753:
            if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar24 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar18 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar24 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar18 < puVar2) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar24 == (char)*puVar18));
            }
            uVar30 = (long)puVar18 - (long)puVar27;
          }
          uVar10 = (long)plVar14 - (long)src;
          plVar22 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar22 + uVar10);
          do {
            *plVar22 = *src;
            plVar22 = plVar22 + 1;
            src = (void *)((long)src + 8);
          } while (plVar22 < plVar19);
          seqStore->lit = seqStore->lit + uVar10;
          if (uVar10 < 0x10000) {
            psVar20 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar20 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = (uVar15 + 4 + uVar30) - 3;
          psVar20->litLength = (U16)uVar10;
          psVar20->offset = iVar12 + 1;
          if (0xffff < uVar33) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar32 = uVar15 + 4 + uVar30;
          psVar20->matchLength = (U16)uVar33;
          seqStore->sequences = psVar20 + 1;
          plVar19 = (long *)((long)plVar14 + lVar32);
          plVar22 = (long *)((long)plVar14 + lVar32 + 1);
          src = plVar19;
          if (plVar19 <= plVar29) {
            pUVar6[(ulong)(*(long *)(pBVar5 + (uVar35 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar11 & 0x3f)] = UVar34 + 2;
            pUVar6[(ulong)(*(long *)((long)plVar19 - 2) * -0x30e4432340650000) >> (bVar11 & 0x3f)] =
                 ((int)plVar19 + -2) - iVar26;
            if ((local_a4 != 0) &&
               (uVar15 = (ulong)local_a4, (int)*plVar19 == *(int *)((long)plVar19 - uVar15))) {
              do {
                plVar22 = plVar19;
                uVar30 = local_88;
                lVar32 = -uVar15;
                local_88 = (ulong)local_a4;
                puVar18 = (ulong *)((long)plVar22 + 4);
                puVar27 = (ulong *)((long)plVar22 + lVar32 + 4);
                puVar24 = puVar18;
                if (puVar18 < puVar1) {
                  if (*puVar27 == *puVar18) {
                    lVar25 = 0;
                    do {
                      puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                      if (puVar1 <= puVar24) {
                        puVar27 = (ulong *)((long)plVar22 + lVar32 + lVar25 + 0xc);
                        puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                        goto LAB_00110950;
                      }
                      uVar15 = *(ulong *)((long)plVar22 + lVar25 + lVar32 + 0xc);
                      uVar35 = *puVar24;
                      lVar25 = lVar25 + 8;
                    } while (uVar15 == uVar35);
                    uVar35 = uVar35 ^ uVar15;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = (uVar15 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar35 = *puVar18 ^ *puVar27;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = uVar15 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00110950:
                  if ((puVar24 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar24))
                  {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar24 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar24 < puVar2) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar27 == (char)*puVar24));
                  }
                  uVar35 = (long)puVar24 - (long)puVar18;
                }
                pUVar6[(ulong)(*plVar22 * -0x30e4432340650000) >> (bVar11 & 0x3f)] =
                     (int)plVar22 - iVar26;
                *(long *)seqStore->lit = *plVar22;
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offset = 1;
                if (0xffff < uVar35 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar19 = (long *)((long)plVar22 + uVar35 + 4);
                psVar20->matchLength = (U16)(uVar35 + 1);
                seqStore->sequences = psVar20 + 1;
                local_a4 = (uint)uVar30;
              } while (((plVar19 <= plVar29) && (local_a4 != 0)) &&
                      (uVar15 = uVar30, (int)*plVar19 == *(int *)((long)plVar19 - uVar30)));
              plVar22 = (long *)((long)plVar22 + uVar35 + 5);
              src = plVar19;
            }
          }
        }
      } while (plVar22 < plVar29);
    }
  }
  else if (uVar7 == 7) {
    if (plVar22 < plVar29) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        lVar32 = *plVar19;
        uVar30 = (ulong)(lVar32 * -0x30e44323405a9d00) >> (bVar11 & 0x3f);
        lVar25 = *plVar22;
        uVar15 = (ulong)(lVar25 * -0x30e44323405a9d00) >> (bVar11 & 0x3f);
        uVar35 = (long)plVar19 - (long)pBVar5;
        uVar7 = pUVar6[uVar30];
        uVar4 = pUVar6[uVar15];
        UVar34 = (U32)uVar35;
        pUVar6[uVar30] = UVar34;
        pUVar6[uVar15] = (int)plVar22 - iVar26;
        uVar13 = (uint)local_88;
        if (uVar13 == 0) {
LAB_001100ed:
          if (((uVar8 < uVar7) &&
              (piVar16 = (int *)(pBVar5 + uVar7), plVar14 = plVar19, *piVar16 == (int)lVar32)) ||
             ((uVar8 < uVar4 &&
              (piVar16 = (int *)(pBVar5 + uVar4), plVar14 = plVar22, *piVar16 == (int)lVar25)))) {
            uVar7 = (int)plVar14 - (int)piVar16;
            local_88 = (ulong)uVar7;
            iVar12 = uVar7 + 2;
            local_a4 = uVar13;
            if ((piVar21 < piVar16) && (src < plVar14)) {
              uVar15 = 0;
              do {
                piVar31 = (int *)((long)piVar16 + -1);
                plVar19 = (long *)((long)plVar14 + -1);
                if ((*(char *)plVar19 != *(char *)piVar31) ||
                   (uVar15 = uVar15 + 1, plVar14 = plVar19, piVar16 = piVar31, piVar31 <= piVar21))
                break;
              } while (src < plVar19);
            }
            else {
              uVar15 = 0;
            }
            goto LAB_001101b9;
          }
          lVar32 = ((long)plVar19 - (long)src >> 7) + uVar9;
          plVar19 = (long *)((long)plVar19 + lVar32);
          plVar22 = (long *)((long)plVar22 + lVar32);
        }
        else {
          piVar16 = (int *)((long)plVar19 + (2 - local_88));
          if (*piVar16 != *(int *)((long)plVar19 + 2)) goto LAB_001100ed;
          uVar15 = (ulong)(*(char *)((long)plVar19 + 1) == *(char *)((long)piVar16 + -1));
          iVar12 = 0;
          plVar14 = (long *)((long)plVar19 + (2 - uVar15));
          piVar16 = (int *)((long)piVar16 - uVar15);
LAB_001101b9:
          puVar27 = (ulong *)((long)plVar14 + uVar15 + 4);
          puVar24 = (ulong *)((long)piVar16 + uVar15 + 4);
          puVar18 = puVar27;
          if (puVar27 < puVar1) {
            if (*puVar24 == *puVar27) {
              lVar32 = 0;
              do {
                puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                if (puVar1 <= puVar18) {
                  puVar24 = (ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                  puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar15 + 0xc);
                  goto LAB_00110249;
                }
                uVar30 = *(ulong *)((long)piVar16 + lVar32 + uVar15 + 0xc);
                uVar10 = *puVar18;
                lVar32 = lVar32 + 8;
              } while (uVar30 == uVar10);
              uVar10 = uVar10 ^ uVar30;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar10 = *puVar27 ^ *puVar24;
              uVar30 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = uVar30 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00110249:
            if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar24 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar18 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar24 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar18 < puVar2) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar24 == (char)*puVar18));
            }
            uVar30 = (long)puVar18 - (long)puVar27;
          }
          uVar10 = (long)plVar14 - (long)src;
          plVar22 = (long *)seqStore->lit;
          plVar19 = (long *)((long)plVar22 + uVar10);
          do {
            *plVar22 = *src;
            plVar22 = plVar22 + 1;
            src = (void *)((long)src + 8);
          } while (plVar22 < plVar19);
          seqStore->lit = seqStore->lit + uVar10;
          if (uVar10 < 0x10000) {
            psVar20 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar20 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = (uVar15 + 4 + uVar30) - 3;
          psVar20->litLength = (U16)uVar10;
          psVar20->offset = iVar12 + 1;
          if (0xffff < uVar33) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar32 = uVar15 + 4 + uVar30;
          psVar20->matchLength = (U16)uVar33;
          seqStore->sequences = psVar20 + 1;
          plVar19 = (long *)((long)plVar14 + lVar32);
          plVar22 = (long *)((long)plVar14 + lVar32 + 1);
          src = plVar19;
          if (plVar19 <= plVar29) {
            pUVar6[(ulong)(*(long *)(pBVar5 + (uVar35 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar11 & 0x3f)] = UVar34 + 2;
            pUVar6[(ulong)(*(long *)((long)plVar19 - 2) * -0x30e44323405a9d00) >> (bVar11 & 0x3f)] =
                 ((int)plVar19 + -2) - iVar26;
            if ((local_a4 != 0) &&
               (uVar15 = (ulong)local_a4, (int)*plVar19 == *(int *)((long)plVar19 - uVar15))) {
              do {
                plVar22 = plVar19;
                uVar30 = local_88;
                lVar32 = -uVar15;
                local_88 = (ulong)local_a4;
                puVar18 = (ulong *)((long)plVar22 + 4);
                puVar27 = (ulong *)((long)plVar22 + lVar32 + 4);
                puVar24 = puVar18;
                if (puVar18 < puVar1) {
                  if (*puVar27 == *puVar18) {
                    lVar25 = 0;
                    do {
                      puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                      if (puVar1 <= puVar24) {
                        puVar27 = (ulong *)((long)plVar22 + lVar32 + lVar25 + 0xc);
                        puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                        goto LAB_00110446;
                      }
                      uVar15 = *(ulong *)((long)plVar22 + lVar25 + lVar32 + 0xc);
                      uVar35 = *puVar24;
                      lVar25 = lVar25 + 8;
                    } while (uVar15 == uVar35);
                    uVar35 = uVar35 ^ uVar15;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = (uVar15 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar35 = *puVar18 ^ *puVar27;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = uVar15 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00110446:
                  if ((puVar24 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar24))
                  {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar24 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar24 < puVar2) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar27 == (char)*puVar24));
                  }
                  uVar35 = (long)puVar24 - (long)puVar18;
                }
                pUVar6[(ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar11 & 0x3f)] =
                     (int)plVar22 - iVar26;
                *(long *)seqStore->lit = *plVar22;
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offset = 1;
                if (0xffff < uVar35 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar19 = (long *)((long)plVar22 + uVar35 + 4);
                psVar20->matchLength = (U16)(uVar35 + 1);
                seqStore->sequences = psVar20 + 1;
                local_a4 = (uint)uVar30;
              } while (((plVar19 <= plVar29) && (local_a4 != 0)) &&
                      (uVar15 = uVar30, (int)*plVar19 == *(int *)((long)plVar19 - uVar30)));
              plVar22 = (long *)((long)plVar22 + uVar35 + 5);
              src = plVar19;
            }
          }
        }
      } while (plVar22 < plVar29);
    }
  }
  else if (plVar22 < plVar29) {
    bVar11 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 - 7);
    do {
      lVar32 = *plVar19;
      uVar13 = (uint)((int)lVar32 * -0x61c8864f) >> (bVar11 & 0x1f);
      lVar25 = *plVar22;
      uVar28 = (uint)((int)lVar25 * -0x61c8864f) >> (bVar11 & 0x1f);
      uVar15 = (long)plVar19 - (long)pBVar5;
      uVar7 = pUVar6[uVar13];
      uVar4 = pUVar6[uVar28];
      UVar34 = (U32)uVar15;
      pUVar6[uVar13] = UVar34;
      pUVar6[uVar28] = (int)plVar22 - iVar26;
      uVar13 = (uint)local_88;
      if (uVar13 == 0) {
LAB_00110fed:
        if (((uVar8 < uVar7) &&
            (piVar16 = (int *)(pBVar5 + uVar7), plVar14 = plVar19, *piVar16 == (int)lVar32)) ||
           ((uVar8 < uVar4 &&
            (piVar16 = (int *)(pBVar5 + uVar4), plVar14 = plVar22, *piVar16 == (int)lVar25)))) {
          uVar7 = (int)plVar14 - (int)piVar16;
          local_88 = (ulong)uVar7;
          iVar12 = uVar7 + 2;
          local_a4 = uVar13;
          if ((piVar21 < piVar16) && (src < plVar14)) {
            uVar30 = 0;
            do {
              piVar31 = (int *)((long)piVar16 + -1);
              plVar19 = (long *)((long)plVar14 + -1);
              if ((*(char *)plVar19 != *(char *)piVar31) ||
                 (uVar30 = uVar30 + 1, piVar16 = piVar31, plVar14 = plVar19, piVar31 <= piVar21))
              break;
            } while (src < plVar19);
          }
          else {
            uVar30 = 0;
          }
          goto LAB_001110bf;
        }
        lVar32 = ((long)plVar19 - (long)src >> 7) + uVar9;
        plVar19 = (long *)((long)plVar19 + lVar32);
        plVar22 = (long *)((long)plVar22 + lVar32);
      }
      else {
        piVar16 = (int *)((long)plVar19 + (2 - local_88));
        if (*piVar16 != *(int *)((long)plVar19 + 2)) goto LAB_00110fed;
        uVar30 = (ulong)(*(char *)((long)plVar19 + 1) == *(char *)((long)piVar16 + -1));
        iVar12 = 0;
        piVar16 = (int *)((long)piVar16 - uVar30);
        plVar14 = (long *)((long)plVar19 + (2 - uVar30));
LAB_001110bf:
        puVar24 = (ulong *)((long)plVar14 + uVar30 + 4);
        puVar27 = (ulong *)((long)piVar16 + uVar30 + 4);
        puVar18 = puVar24;
        if (puVar24 < puVar1) {
          if (*puVar27 == *puVar24) {
            lVar32 = 0;
            do {
              puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar30 + 0xc);
              if (puVar1 <= puVar18) {
                puVar27 = (ulong *)((long)piVar16 + lVar32 + uVar30 + 0xc);
                puVar18 = (ulong *)((long)plVar14 + lVar32 + uVar30 + 0xc);
                goto LAB_00111152;
              }
              uVar35 = *(ulong *)((long)piVar16 + lVar32 + uVar30 + 0xc);
              uVar10 = *puVar18;
              lVar32 = lVar32 + 8;
            } while (uVar35 == uVar10);
            uVar10 = uVar10 ^ uVar35;
            uVar35 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar32;
          }
          else {
            uVar10 = *puVar24 ^ *puVar27;
            uVar35 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00111152:
          if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar18 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar18 < puVar2) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar27 == (char)*puVar18));
          }
          uVar35 = (long)puVar18 - (long)puVar24;
        }
        uVar10 = (long)plVar14 - (long)src;
        plVar22 = (long *)seqStore->lit;
        plVar19 = (long *)((long)plVar22 + uVar10);
        do {
          *plVar22 = *src;
          plVar22 = plVar22 + 1;
          src = (void *)((long)src + 8);
        } while (plVar22 < plVar19);
        seqStore->lit = seqStore->lit + uVar10;
        if (uVar10 < 0x10000) {
          psVar20 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar20 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        uVar33 = (uVar30 + 4 + uVar35) - 3;
        psVar20->litLength = (U16)uVar10;
        psVar20->offset = iVar12 + 1;
        if (0xffff < uVar33) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar32 = uVar30 + 4 + uVar35;
        psVar20->matchLength = (U16)uVar33;
        seqStore->sequences = psVar20 + 1;
        plVar19 = (long *)((long)plVar14 + lVar32);
        plVar22 = (long *)((long)plVar14 + lVar32 + 1);
        src = plVar19;
        if (plVar19 <= plVar29) {
          pUVar6[(uint)(*(int *)(pBVar5 + (uVar15 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar11 & 0x1f)] = UVar34 + 2;
          pUVar6[(uint)(*(int *)((long)plVar19 - 2) * -0x61c8864f) >> (bVar11 & 0x1f)] =
               ((int)plVar19 + -2) - iVar26;
          if (local_a4 != 0) {
            uVar15 = (ulong)local_a4;
            iVar12 = (int)*plVar19;
            if (iVar12 == *(int *)((long)plVar19 - uVar15)) {
              do {
                plVar22 = plVar19;
                uVar30 = local_88;
                lVar32 = -uVar15;
                local_88 = (ulong)local_a4;
                puVar18 = (ulong *)((long)plVar22 + 4);
                puVar27 = (ulong *)((long)plVar22 + lVar32 + 4);
                puVar24 = puVar18;
                if (puVar18 < puVar1) {
                  if (*puVar27 == *puVar18) {
                    lVar25 = 0;
                    do {
                      puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                      if (puVar1 <= puVar24) {
                        puVar27 = (ulong *)((long)plVar22 + lVar32 + lVar25 + 0xc);
                        puVar24 = (ulong *)((long)plVar22 + lVar25 + 0xc);
                        goto LAB_00111355;
                      }
                      uVar15 = *(ulong *)((long)plVar22 + lVar25 + lVar32 + 0xc);
                      uVar35 = *puVar24;
                      lVar25 = lVar25 + 8;
                    } while (uVar15 == uVar35);
                    uVar35 = uVar35 ^ uVar15;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = (uVar15 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar35 = *puVar18 ^ *puVar27;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    uVar35 = uVar15 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00111355:
                  if ((puVar24 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar24))
                  {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar24 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar24 < puVar2) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar27 == (char)*puVar24));
                  }
                  uVar35 = (long)puVar24 - (long)puVar18;
                }
                pUVar6[(uint)(iVar12 * -0x61c8864f) >> (bVar11 & 0x1f)] = (int)plVar22 - iVar26;
                *(long *)seqStore->lit = *plVar22;
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offset = 1;
                if (0xffff < uVar35 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar19 = (long *)((long)plVar22 + uVar35 + 4);
                psVar20->matchLength = (U16)(uVar35 + 1);
                seqStore->sequences = psVar20 + 1;
                local_a4 = (uint)uVar30;
              } while (((plVar19 <= plVar29) && (local_a4 != 0)) &&
                      (iVar12 = (int)*plVar19, uVar15 = uVar30,
                      iVar12 == *(int *)((long)plVar19 - uVar30)));
              plVar22 = (long *)((long)plVar22 + uVar35 + 5);
              src = plVar19;
            }
          }
        }
      }
    } while (plVar22 < plVar29);
  }
  uVar8 = 0;
  if (uVar23 < uVar17) {
    uVar8 = uVar17;
  }
  if (uVar23 < uVar3) {
    uVar8 = uVar3;
  }
  uVar17 = (uint)local_88;
  if ((uint)local_88 == 0) {
    uVar17 = uVar8;
  }
  if (local_a4 != 0) {
    uVar8 = local_a4;
  }
  *rep = uVar17;
  rep[1] = uVar8;
  return (long)puVar2 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}